

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O2

int vorbis_synthesis_lapout(vorbis_dsp_state *v,float ***pcm)

{
  float fVar1;
  vorbis_info *pvVar2;
  long *plVar3;
  long lVar4;
  float *pfVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  pvVar2 = v->vi;
  plVar3 = (long *)pvVar2->codec_setup;
  uVar7 = v->W;
  lVar4 = plVar3[uVar7];
  bVar8 = (char)plVar3[0x2d2] + 1;
  uVar10 = *plVar3 >> (bVar8 & 0x3f);
  uVar12 = plVar3[1] >> (bVar8 & 0x3f);
  iVar13 = v->pcm_returned;
  if (iVar13 < 0) {
    return 0;
  }
  iVar11 = (int)uVar12;
  if (v->centerW == (long)iVar11) {
    uVar15 = 0;
    uVar16 = 0;
    if (0 < iVar11) {
      uVar16 = uVar12 & 0xffffffff;
    }
    uVar12 = (ulong)(uint)pvVar2->channels;
    if (pvVar2->channels < 1) {
      uVar12 = uVar15;
    }
    for (; uVar15 != uVar12; uVar15 = uVar15 + 1) {
      pfVar5 = v->pcm[uVar15];
      for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
        fVar1 = pfVar5[uVar14];
        pfVar5[uVar14] = pfVar5[(long)iVar11 + uVar14];
        pfVar5[(long)iVar11 + uVar14] = fVar1;
      }
    }
    v->pcm_current = v->pcm_current - iVar11;
    iVar13 = iVar13 - iVar11;
    v->pcm_returned = iVar13;
    v->centerW = 0;
  }
  iVar9 = (int)uVar10;
  if ((uVar7 ^ v->lW) == 1) {
    iVar6 = (iVar11 - iVar9) / 2;
    uVar10 = 0;
    uVar7 = (ulong)(uint)pvVar2->channels;
    if (pvVar2->channels < 1) {
      uVar7 = uVar10;
    }
    for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
      pfVar5 = v->pcm[uVar10];
      for (uVar12 = (long)(iVar11 + iVar9) / 2 & 0xffffffff; 0 < (int)uVar12; uVar12 = uVar12 - 1) {
        pfVar5[(long)iVar6 + (uVar12 - 1)] = pfVar5[uVar12 - 1];
      }
    }
  }
  else {
    if (v->lW != 0) goto LAB_001b4bc8;
    uVar12 = 0;
    uVar7 = (ulong)(uint)pvVar2->channels;
    if (pvVar2->channels < 1) {
      uVar7 = uVar12;
    }
    for (; uVar12 != uVar7; uVar12 = uVar12 + 1) {
      pfVar5 = v->pcm[uVar12];
      for (uVar15 = uVar10 & 0xffffffff; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
        pfVar5[((long)iVar11 + (uVar15 - 1)) - (long)iVar9] = pfVar5[uVar15 - 1];
      }
    }
    iVar6 = iVar11 - iVar9;
  }
  iVar13 = iVar13 + iVar6;
  v->pcm_returned = iVar13;
  v->pcm_current = v->pcm_current + iVar6;
LAB_001b4bc8:
  if (pcm != (float ***)0x0) {
    uVar10 = 0;
    uVar7 = (ulong)(uint)pvVar2->channels;
    if (pvVar2->channels < 1) {
      uVar7 = uVar10;
    }
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      v->pcmret[uVar10] = v->pcm[uVar10] + iVar13;
    }
    *pcm = v->pcmret;
  }
  return ((int)(lVar4 >> (bVar8 & 0x3f)) + iVar11) - iVar13;
}

Assistant:

int vorbis_synthesis_lapout(vorbis_dsp_state *v,float ***pcm){
  vorbis_info *vi=v->vi;
  codec_setup_info *ci=vi->codec_setup;
  int hs=ci->halfrate_flag;

  int n=ci->blocksizes[v->W]>>(hs+1);
  int n0=ci->blocksizes[0]>>(hs+1);
  int n1=ci->blocksizes[1]>>(hs+1);
  int i,j;

  if(v->pcm_returned<0)return 0;

  /* our returned data ends at pcm_returned; because the synthesis pcm
     buffer is a two-fragment ring, that means our data block may be
     fragmented by buffering, wrapping or a short block not filling
     out a buffer.  To simplify things, we unfragment if it's at all
     possibly needed. Otherwise, we'd need to call lapout more than
     once as well as hold additional dsp state.  Opt for
     simplicity. */

  /* centerW was advanced by blockin; it would be the center of the
     *next* block */
  if(v->centerW==n1){
    /* the data buffer wraps; swap the halves */
    /* slow, sure, small */
    for(j=0;j<vi->channels;j++){
      float *p=v->pcm[j];
      for(i=0;i<n1;i++){
        float temp=p[i];
        p[i]=p[i+n1];
        p[i+n1]=temp;
      }
    }

    v->pcm_current-=n1;
    v->pcm_returned-=n1;
    v->centerW=0;
  }

  /* solidify buffer into contiguous space */
  if((v->lW^v->W)==1){
    /* long/short or short/long */
    for(j=0;j<vi->channels;j++){
      float *s=v->pcm[j];
      float *d=v->pcm[j]+(n1-n0)/2;
      for(i=(n1+n0)/2-1;i>=0;--i)
        d[i]=s[i];
    }
    v->pcm_returned+=(n1-n0)/2;
    v->pcm_current+=(n1-n0)/2;
  }else{
    if(v->lW==0){
      /* short/short */
      for(j=0;j<vi->channels;j++){
        float *s=v->pcm[j];
        float *d=v->pcm[j]+n1-n0;
        for(i=n0-1;i>=0;--i)
          d[i]=s[i];
      }
      v->pcm_returned+=n1-n0;
      v->pcm_current+=n1-n0;
    }
  }

  if(pcm){
    int i;
    for(i=0;i<vi->channels;i++)
      v->pcmret[i]=v->pcm[i]+v->pcm_returned;
    *pcm=v->pcmret;
  }

  return(n1+n-v->pcm_returned);

}